

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O2

Font * __thiscall ResourceManager::getFont(ResourceManager *this,path *filename)

{
  bool bVar1;
  iterator iVar2;
  mapped_type *this_00;
  runtime_error *this_01;
  path *in_RCX;
  format_string_t<const_ghc::filesystem::path_&> fmt;
  string sStack_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar2 = std::
          _Rb_tree<ghc::filesystem::path,_std::pair<const_ghc::filesystem::path,_sf::Font>,_std::_Select1st<std::pair<const_ghc::filesystem::path,_sf::Font>_>,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Font>_>_>
          ::find(&(this->fonts_)._M_t,filename);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->fonts_)._M_t._M_impl.super__Rb_tree_header) {
    fmt.str.size_ = (size_t)filename;
    fmt.str.data_ = (char *)0x20;
    spdlog::debug<ghc::filesystem::path_const&>
              ((spdlog *)"ResourceManager loading font {}.",fmt,in_RCX);
    this_00 = std::
              map<ghc::filesystem::path,_sf::Font,_std::less<ghc::filesystem::path>,_std::allocator<std::pair<const_ghc::filesystem::path,_sf::Font>_>_>
              ::operator[](&this->fonts_,filename);
    ghc::filesystem::path::string_abi_cxx11_(&sStack_88,filename);
    bVar1 = sf::Font::loadFromFile(this_00,&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    if (!bVar1) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_(&local_68,filename);
      std::operator+(&local_48,"\"",&local_68);
      std::operator+(&sStack_88,&local_48,"\": unable to load font file.");
      std::runtime_error::runtime_error(this_01,(string *)&sStack_88);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    this_00 = (mapped_type *)(iVar2._M_node + 2);
  }
  return this_00;
}

Assistant:

sf::Font& ResourceManager::getFont(const fs::path& filename) {
    auto font = fonts_.find(filename);
    if (font != fonts_.end()) {
        return font->second;
    }
    spdlog::debug("ResourceManager loading font {}.", filename);
    sf::Font& newFont = fonts_[filename];
    if (!newFont.loadFromFile(filename.string())) {
        throw std::runtime_error("\"" + filename.string() + "\": unable to load font file.");
    }
    return newFont;
}